

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O2

void intgemm::anon_unknown_0::TestPrepareA<intgemm::SSSE3::Kernels8>(Index rows,Index cols)

{
  float *pfVar1;
  long lVar2;
  ulong size;
  result_type_conflict rVar3;
  AlignedVector<unsigned_char> newA;
  AlignedVector<signed_char> oldA;
  AlignedVector<float> inputA;
  param_type local_13c0;
  mt19937 gen;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  local_13c0._M_a = -2.0;
  local_13c0._M_b = 2.0;
  size = (ulong)(cols * rows);
  AlignedVector<float>::AlignedVector(&inputA,size,0x40);
  pfVar1 = inputA.mem_;
  for (lVar2 = 0; inputA.size_ << 2 != lVar2; lVar2 = lVar2 + 4) {
    rVar3 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13c0,&gen);
    *(result_type_conflict *)((long)pfVar1 + lVar2) = rVar3;
  }
  AlignedVector<signed_char>::AlignedVector(&oldA,size,0x40);
  AlignedVector<unsigned_char>::AlignedVector(&newA,size,0x40);
  SSSE3::Kernels8::PrepareA(inputA.mem_,oldA.mem_,64.0,rows,cols);
  SSSE3::Kernels8::PrepareA(inputA.mem_,newA.mem_,64.0,rows,cols);
  CompareAs(oldA.mem_,newA.mem_,rows,cols);
  free(newA.mem_);
  free(oldA.mem_);
  free(inputA.mem_);
  return;
}

Assistant:

void TestPrepareA(Index rows, Index cols) {
  std::mt19937 gen;
  // Go somewhat out of range too.
  std::uniform_real_distribution<float> dist(-2, 2);
  // Create array.
  AlignedVector<float> inputA(rows * cols);
  for (auto& it : inputA) {
    it = dist(gen);
  }
  AlignedVector<int8_t> oldA(rows * cols);
  AlignedVector<uint8_t> newA(rows * cols);
  float quant_mult = 64; //From example
  Routine::PrepareA(inputA.begin(), oldA.begin(), quant_mult, rows, cols);
  Routine::PrepareA(inputA.begin(), newA.begin(), quant_mult, rows, cols);
  CompareAs(oldA.begin(), newA.begin(), rows, cols);
}